

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_functions.cpp
# Opt level: O2

ir_function_signature * __thiscall
anon_unknown.dwarf_dde02::builtin_builder::_EmitStreamVertex
          (builtin_builder *this,builtin_available_predicate avail,glsl_type *stream_type)

{
  ir_variable *this_00;
  ir_function_signature *piVar1;
  ir_emit_vertex *this_01;
  ir_dereference_variable *stream;
  ir_variable *var;
  ir_factory body;
  
  this_00 = (ir_variable *)exec_node::operator_new(0x90,builtins.mem_ctx);
  ir_variable::ir_variable(this_00,(glsl_type *)this,"stream",ir_var_const_in);
  piVar1 = new_sig(&builtins,&glsl_type::_void_type,gs_streams,1,this_00);
  var = (ir_variable *)builtins.mem_ctx;
  body.instructions = &piVar1->body;
  body.mem_ctx = builtins.mem_ctx;
  piVar1->field_0x48 = piVar1->field_0x48 | 1;
  this_01 = (ir_emit_vertex *)exec_node::operator_new(0x28,var);
  stream = var_ref((builtin_builder *)this_00,var);
  ir_emit_vertex::ir_emit_vertex(this_01,(ir_rvalue *)stream);
  ir_builder::ir_factory::emit(&body,(ir_instruction *)this_01);
  return piVar1;
}

Assistant:

ir_function_signature *
builtin_builder::_EmitStreamVertex(builtin_available_predicate avail,
                                   const glsl_type *stream_type)
{
   /* Section 8.12 (Geometry Shader Functions) of the GLSL 4.0 spec says:
    *
    *     "Emit the current values of output variables to the current output
    *     primitive on stream stream. The argument to stream must be a constant
    *     integral expression."
    */
   ir_variable *stream =
      new(mem_ctx) ir_variable(stream_type, "stream", ir_var_const_in);

   MAKE_SIG(glsl_type::void_type, avail, 1, stream);

   body.emit(new(mem_ctx) ir_emit_vertex(var_ref(stream)));

   return sig;
}